

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

void __thiscall
CTPNCodeBodyBase::CTPNCodeBodyBase
          (CTPNCodeBodyBase *this,CTcPrsSymtab *lcltab,CTcPrsSymtab *gototab,CTPNStm *stm,int argc,
          int opt_argc,int varargs,int varargs_list,CTcSymLocal *varargs_list_local,int local_cnt,
          int self_valid,CTcCodeBodyRef *enclosing_code_body)

{
  CTcTokFileDesc *pCVar1;
  long lVar2;
  _func_int **in_RCX;
  undefined2 in_DX;
  undefined6 in_register_00000012;
  undefined8 in_RSI;
  CTPNStmTop *in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  ushort in_stack_00000008;
  
  CTPNStmTop::CTPNStmTop(in_RDI);
  (in_RDI->super_CTPNStm).super_CTPNStmBase.super_CTcPrsNode.super_CTcPrsNodeBase.
  _vptr_CTcPrsNodeBase = (_func_int **)&PTR___cxa_pure_virtual_0042fe80;
  *(undefined8 *)&in_RDI[1].dyn_obj_id_ = in_RSI;
  in_RDI[1].next_stm_top_ = (CTPNStmTop *)CONCAT62(in_register_00000012,in_DX);
  in_RDI[2].super_CTPNStm.super_CTPNStmBase.super_CTcPrsNode.super_CTcPrsNodeBase.
  _vptr_CTcPrsNodeBase = in_RCX;
  *(undefined4 *)((long)&in_RDI[3].super_CTPNStm.super_CTPNStmBase.next_stm_ + 4) = in_R8D;
  *(undefined4 *)&in_RDI[3].super_CTPNStm.super_CTPNStmBase.file_ = in_R9D;
  *(ushort *)&in_RDI[3].next_stm_top_ =
       *(ushort *)&in_RDI[3].next_stm_top_ & 0xfffd | (in_stack_00000008 & 1) << 1;
  *(ushort *)&in_RDI[3].next_stm_top_ =
       *(ushort *)&in_RDI[3].next_stm_top_ & 0xfffe | (ushort)opt_argc & 1;
  in_RDI[3].super_CTPNStm.super_CTPNStmBase.linenum_ = (long)stm;
  *(undefined4 *)&in_RDI[3].super_CTPNStm.super_CTPNStmBase.next_stm_ = gototab._0_4_;
  *(ushort *)&in_RDI[3].next_stm_top_ =
       *(ushort *)&in_RDI[3].next_stm_top_ & 0xffbf | ((ushort)lcltab & 1) << 6;
  *(ushort *)&in_RDI[3].next_stm_top_ = *(ushort *)&in_RDI[3].next_stm_top_ & 0xff7f;
  *(ushort *)&in_RDI[3].next_stm_top_ = *(ushort *)&in_RDI[3].next_stm_top_ & 0xfeff;
  *(ushort *)&in_RDI[3].next_stm_top_ = *(ushort *)&in_RDI[3].next_stm_top_ & 0xfdff;
  *(ushort *)&in_RDI[3].next_stm_top_ = *(ushort *)&in_RDI[3].next_stm_top_ & 0xfbff;
  *(ushort *)&in_RDI[3].next_stm_top_ = *(ushort *)&in_RDI[3].next_stm_top_ & 0xf7ff;
  *(ushort *)&in_RDI[3].next_stm_top_ = *(ushort *)&in_RDI[3].next_stm_top_ & 0xefff;
  *(CTPNCodeBodyBase **)&in_RDI[2].dyn_obj_id_ = this;
  *(ushort *)&in_RDI[3].next_stm_top_ = *(ushort *)&in_RDI[3].next_stm_top_ & 0xfff7;
  *(undefined4 *)&in_RDI[3].field_0x24 = 0;
  in_RDI[3].super_CTPNStm.super_CTPNStmBase.super_CTcPrsNode.super_CTcPrsNodeBase.
  _vptr_CTcPrsNodeBase = (_func_int **)0x0;
  in_RDI[2].next_stm_top_ = (CTPNStmTop *)0x0;
  *(ushort *)&in_RDI[3].next_stm_top_ = *(ushort *)&in_RDI[3].next_stm_top_ & 0xffef;
  *(ushort *)&in_RDI[3].next_stm_top_ = *(ushort *)&in_RDI[3].next_stm_top_ & 0xffdf;
  in_RDI[2].super_CTPNStm.super_CTPNStmBase.file_ = (CTcTokFileDesc *)0x0;
  in_RDI[2].super_CTPNStm.super_CTPNStmBase.next_stm_ =
       (CTPNStm *)&in_RDI[2].super_CTPNStm.super_CTPNStmBase.linenum_;
  in_RDI[2].super_CTPNStm.super_CTPNStmBase.linenum_ = 0;
  *(ushort *)&in_RDI[3].next_stm_top_ = *(ushort *)&in_RDI[3].next_stm_top_ & 0xfffb;
  in_RDI[1].super_CTPNStm.super_CTPNStmBase.super_CTcPrsNode.super_CTcPrsNodeBase.
  _vptr_CTcPrsNodeBase = (_func_int **)0x0;
  in_RDI[1].super_CTPNStm.super_CTPNStmBase.next_stm_ = (CTPNStm *)0x0;
  pCVar1 = CTcTokenizer::get_last_desc(G_tok);
  in_RDI[1].super_CTPNStm.super_CTPNStmBase.file_ = pCVar1;
  lVar2 = CTcTokenizer::get_last_linenum(G_tok);
  in_RDI[1].super_CTPNStm.super_CTPNStmBase.linenum_ = lVar2;
  return;
}

Assistant:

CTPNCodeBodyBase::CTPNCodeBodyBase(
    CTcPrsSymtab *lcltab, CTcPrsSymtab *gototab, CTPNStm *stm,
    int argc, int opt_argc, int varargs,
    int varargs_list, CTcSymLocal *varargs_list_local, int local_cnt,
    int self_valid, CTcCodeBodyRef *enclosing_code_body)
{
    /* remember the data in the code body */
    lcltab_ = lcltab;
    gototab_ = gototab;
    stm_ = stm;
    argc_ = argc;
    opt_argc_ = opt_argc;
    varargs_ = varargs;
    varargs_list_ = varargs_list;
    varargs_list_local_ = varargs_list_local;
    local_cnt_ = local_cnt;
    self_valid_ = self_valid;
    self_referenced_ = FALSE;
    full_method_ctx_referenced_ = FALSE;
    op_overload_ = FALSE;
    is_anon_method_ = FALSE;
    is_dyn_func_ = FALSE;
    is_dyn_method_ = FALSE;

    /* remember the enclosing code body */
    enclosing_code_body_ = enclosing_code_body;

    /* presume we won't need a local context object */
    has_local_ctx_ = FALSE;
    local_ctx_arr_size_ = 0;
    ctx_head_ = ctx_tail_ = 0;
    local_ctx_needs_self_ = FALSE;
    local_ctx_needs_full_method_ctx_ = FALSE;

    /* presume we have an internal fixup list */
    fixup_owner_sym_ = 0;
    fixup_list_anchor_ = &internal_fixups_;

    /* no internal fixups yet */
    internal_fixups_ = 0;

    /* we haven't been replaced yet */
    replaced_ = FALSE;

    /* leave it up to the caller to set the starting location */
    start_desc_ = 0;
    start_linenum_ = 0;

    /* 
     *   remember the source location of the closing brace, which should
     *   be the current location when we're instantiated 
     */
    end_desc_ = G_tok->get_last_desc();
    end_linenum_ = G_tok->get_last_linenum();
}